

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_cluster_data_cleanup(int delete_file)

{
  fio_ls_s *pfVar1;
  fio_ls_s *pfVar2;
  void *uuid;
  fio_ls_s *__ptr;
  
  if ((delete_file != 0) && (cluster_data.name[0] != '\0')) {
    unlink(cluster_data.name);
  }
  while (__ptr = cluster_data.clients.prev, cluster_data.clients.next != &cluster_data.clients) {
    if ((cluster_data.clients.prev != (fio_ls_s *)0x0) &&
       (pfVar1 = (cluster_data.clients.prev)->next, pfVar1 != cluster_data.clients.prev)) {
      pfVar2 = (cluster_data.clients.prev)->prev;
      uuid = (cluster_data.clients.prev)->obj;
      pfVar1->prev = pfVar2;
      pfVar2->next = pfVar1;
      free(__ptr);
      if (0 < (long)uuid) {
        fio_close((intptr_t)uuid);
      }
    }
  }
  cluster_data.uuid = 0;
  cluster_data.lock = '\0';
  cluster_data.clients.prev = &cluster_data.clients;
  cluster_data.clients.next = &cluster_data.clients;
  cluster_data.clients.obj = (void *)0x0;
  return;
}

Assistant:

static void fio_cluster_data_cleanup(int delete_file) {
  if (delete_file && cluster_data.name[0]) {
#if DEBUG
    FIO_LOG_DEBUG("(%d) unlinking cluster's Unix socket.", (int)getpid());
#endif
    unlink(cluster_data.name);
  }
  while (fio_ls_any(&cluster_data.clients)) {
    intptr_t uuid = (intptr_t)fio_ls_pop(&cluster_data.clients);
    if (uuid > 0) {
      fio_close(uuid);
    }
  }
  cluster_data.uuid = 0;
  cluster_data.lock = FIO_LOCK_INIT;
  cluster_data.clients = (fio_ls_s)FIO_LS_INIT(cluster_data.clients);
}